

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.hpp
# Opt level: O0

bool pstore::command_line::details::
     parse_command_line_options<char*const*,std::ostream,std::ostream>
               (char **first_arg,char **last_arg,string *overview,
               basic_ostream<char,_std::char_traits<char>_> *outs,
               basic_ostream<char,_std::char_traits<char>_> *errs)

{
  char *pcVar1;
  bool bVar2;
  tuple<char*const*&,bool&> local_208 [16];
  tuple<char_*const_*,_bool> local_1f8;
  byte local_1e2;
  allocator local_1e1;
  string local_1e0 [6];
  bool ok;
  name local_1c0;
  string local_1a0 [32];
  string local_180 [32];
  undefined1 local_160 [8];
  help<std::basic_ostream<char,_std::char_traits<char>_>_> help;
  allocator local_79;
  string local_78 [32];
  path local_58 [8];
  string program_name;
  basic_ostream<char,_std::char_traits<char>_> *errs_local;
  basic_ostream<char,_std::char_traits<char>_> *outs_local;
  string *overview_local;
  char **last_arg_local;
  char **first_arg_local;
  
  last_arg_local = first_arg + 1;
  pcVar1 = *first_arg;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,pcVar1,&local_79);
  pstore::path::base_name(local_58,(string *)local_78);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::__cxx11::string::string(local_180,(string *)local_58);
  std::__cxx11::string::string(local_1a0,(string *)overview);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e0,"help",&local_1e1);
  command_line::name::name(&local_1c0,(string *)local_1e0);
  help<std::basic_ostream<char,_std::char_traits<char>_>_>::help<pstore::command_line::name>
            ((help<std::basic_ostream<char,_std::char_traits<char>_>_> *)local_160,
             (string *)local_180,(string *)local_1a0,outs,&local_1c0);
  command_line::name::~name(&local_1c0);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  std::__cxx11::string::~string(local_1a0);
  std::__cxx11::string::~string(local_180);
  local_1e2 = 1;
  parse_option_arguments<char*const*,std::ostream>
            ((details *)&local_1f8,last_arg_local,last_arg,(string *)local_58,errs);
  std::tie<char*const*,bool>((char ***)local_208,(bool *)&last_arg_local);
  std::tuple<char*const*&,bool&>::operator=(local_208,&local_1f8);
  if ((local_1e2 & 1) == 0) {
    first_arg_local._7_1_ = false;
  }
  else {
    bVar2 = parse_positional_arguments<char*const*>(last_arg_local,last_arg);
    if (bVar2) {
      first_arg_local._7_1_ = check_for_missing<std::ostream>((string *)local_58,errs);
    }
    else {
      first_arg_local._7_1_ = false;
    }
  }
  help<std::basic_ostream<char,_std::char_traits<char>_>_>::~help
            ((help<std::basic_ostream<char,_std::char_traits<char>_>_> *)local_160);
  std::__cxx11::string::~string((string *)local_58);
  return (bool)(first_arg_local._7_1_ & 1);
}

Assistant:

bool parse_command_line_options (InputIterator first_arg, InputIterator last_arg,
                                             std::string const & overview, OutputStream & outs,
                                             ErrorStream & errs) {
                std::string const program_name = pstore::path::base_name (*(first_arg++));
                help<OutputStream> const help (program_name, overview, outs, name ("help"));

                bool ok = true;
                std::tie (first_arg, ok) =
                    parse_option_arguments (first_arg, last_arg, program_name, errs);
                if (!ok) {
                    return false;
                }
                if (!parse_positional_arguments (first_arg, last_arg)) {
                    return false;
                }
                return check_for_missing (program_name, errs);
            }